

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O0

RelationsMap *
dg::vr::RelationsGraph<dg::vr::ValueRelations>::filterResult
          (Relations *relations,RelationsMap *result)

{
  bool bVar1;
  RelationsMap *in_RSI;
  iterator it;
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  *in_stack_ffffffffffffffc8;
  _Base_ptr in_stack_ffffffffffffffd0;
  iterator in_stack_ffffffffffffffd8;
  _Self local_20;
  _Self local_18;
  RelationsMap *local_10;
  
  local_10 = in_RSI;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                  *)0x1e005b);
    bVar1 = Relations::anyCommon
                      ((Relations *)in_stack_ffffffffffffffd0,(Relations *)in_stack_ffffffffffffffc8
                      );
    if (bVar1) {
      std::
      _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                    *)in_stack_ffffffffffffffd0);
    }
    else {
      in_stack_ffffffffffffffd8 =
           std::
           map<std::reference_wrapper<dg::vr::Bucket_const>,dg::vr::Relations,std::less<std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>>>
           ::erase_abi_cxx11_(local_18._M_node,in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffd0 = local_18._M_node;
      local_18._M_node = in_stack_ffffffffffffffd8._M_node;
    }
  }
  return local_10;
}

Assistant:

static RelationsMap &filterResult(const Relations &relations,
                                      RelationsMap &result) {
        for (auto it = result.begin(); it != result.end();) {
            if (!it->second.anyCommon(relations))
                it = result.erase(it);
            else
                ++it;
        }
        return result;
    }